

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManFixPoDrivers(Nf_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Nf_Obj_t *pNVar5;
  uint uVar6;
  undefined8 uVar7;
  Gia_Man_t *pGVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  uint i;
  undefined8 *puVar11;
  Nf_Mat_t *pM;
  long lVar12;
  
  pGVar8 = p->pGia;
  pVVar9 = pGVar8->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar1 = pVVar9->pArray[lVar12];
      if (((long)iVar1 < 0) || (pGVar8->nObjs <= iVar1)) {
LAB_00793cdc:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pGVar8->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar10 = *(uint *)(pGVar3 + iVar1);
      i = iVar1 - (uVar10 & 0x1fffffff);
      if (((int)i < 0) || ((uint)pGVar8->nObjs <= i)) goto LAB_00793cdc;
      if ((~*(uint *)(pGVar3 + i) & 0x1fffffff) != 0 && -1 < (int)*(uint *)(pGVar3 + i)) {
        uVar6 = i * 2;
        uVar2 = (p->vMapRefs).nSize;
        if (uVar2 == uVar6 || SBORROW4(uVar2,uVar6) != (int)(uVar2 + i * -2) < 0) {
LAB_00793cfb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4 = (p->vMapRefs).pArray;
        if (piVar4[uVar6] != 0) {
          if (uVar2 <= (uVar6 | 1)) goto LAB_00793cfb;
          if (piVar4[uVar6 | 1] != 0) {
            uVar10 = uVar10 >> 0x1d & 1;
            pNVar5 = p->pNfObjs;
            if (((((&pNVar5[i].M[0][0].field_0x3)[uVar10 << 5] & 0x40) == 0) &&
                (puVar11 = (undefined8 *)(&pNVar5[i].M[0][0].field_0x0 + ((uVar10 ^ 1) << 5)),
                (*(byte *)((long)puVar11 + 3) & 0x40) == 0)) &&
               (p->InvDelayI + *(int *)(puVar11 + 1) <= p->pPars->MapDelay)) {
              pM = (Nf_Mat_t *)(&pNVar5[i].M[0][0].field_0x0 + (uVar10 << 5));
              Nf_MatchDeref_rec(p,i,uVar10,pM);
              uVar10 = (*(uint *)(pGVar3 + iVar1) >> 0x1d & 1 | uVar6) ^ 1;
              if ((p->vMapRefs).nSize <= (int)uVar10) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
              }
              piVar4 = (p->vMapRefs).pArray + uVar10;
              *piVar4 = *piVar4 + 1;
              uVar7 = puVar11[1];
              *(undefined8 *)pM = *puVar11;
              pM->D = (int)uVar7;
              pM->F = (float)(int)((ulong)uVar7 >> 0x20);
              pM->D = pM->D + p->InvDelayI;
              pM->field_0x3 = pM->field_0x3 | 0xc0;
              *(byte *)((long)puVar11 + 3) = *(byte *)((long)puVar11 + 3) | 0x80;
              pGVar8 = p->pGia;
            }
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar9 = pGVar8->vCos;
    } while (lVar12 < pVVar9->nSize);
  }
  return;
}

Assistant:

void Nf_ManFixPoDrivers( Nf_Man_t * p )
{
    Gia_Obj_t * pObj;
    Nf_Mat_t * pM, * pMc;
    int i, iDriver, Count = 0;
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iDriver = Gia_ObjFaninId0p(p->pGia, pObj);
        if ( !Gia_ObjIsAnd(Gia_ManObj(p->pGia, iDriver)) )
            continue;
        // skip unless both are used
        if ( !Nf_ObjMapRefNum(p, iDriver, 0) || !Nf_ObjMapRefNum(p, iDriver, 1) )
            continue;
        pM  = Nf_ObjMatchD( p, iDriver,  Gia_ObjFaninC0(pObj) );
        pMc = Nf_ObjMatchD( p, iDriver, !Gia_ObjFaninC0(pObj) );
        // skip unless both are non-complemented
        if ( pM->fCompl || pMc->fCompl )
            continue;
        // skip if arrival time exceeds the required time
        if ( pMc->D + p->InvDelayI > p->pPars->MapDelay )
            continue;
        // update references
        Nf_MatchDeref_rec( p, iDriver, Gia_ObjFaninC0(pObj), pM );
        Nf_ObjMapRefInc( p, iDriver, !Gia_ObjFaninC0(pObj) );
        // add inverter
        *pM = *pMc;
        pM->D += p->InvDelayI;
        pM->fCompl = 1;
        pM->fBest = 1;
        pMc->fBest = 1;
        Count++;
    }
    //printf( "Fixed %d PO drivers.\n", Count );
}